

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetTXToolInfo(ndicapi *pol,int ph)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  
  uVar1 = pol->TxHandleCount;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar3) {
LAB_001083f6:
      iVar2 = 0;
      if ((uint)uVar5 != uVar1) {
        uVar4 = ndiHexToUnsignedLong(pol->TxInformation[uVar5],2);
        iVar2 = (int)uVar4;
      }
      return iVar2;
    }
    if ((uint)pol->TxHandles[uVar3] == ph) {
      uVar5 = uVar3 & 0xffffffff;
      goto LAB_001083f6;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

ndicapiExport int ndiGetTXToolInfo(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxInformation[i];
  return (int)ndiHexToUnsignedLong(dp, 2);
}